

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BasicTexImage2DCase::createTexture(BasicTexImage2DCase *this)

{
  deUint32 type;
  float height;
  float width;
  int x;
  int y;
  deUint32 dVar1;
  char *str;
  void *data;
  int local_12c;
  PixelBufferAccess local_120;
  PixelBufferAccess local_f8;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  undefined1 local_b0 [8];
  Vec4 gMax;
  Vector<float,_4> local_90;
  undefined1 local_80 [8];
  Vec4 gMin;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_58 [8];
  Random rnd;
  TextureLevel levelData;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  BasicTexImage2DCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_12c = 1;
  }
  else {
    x = ::deLog2Floor32((this->super_TextureSpecCase).m_width);
    y = ::deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_12c = de::max<int>(x,y);
    local_12c = local_12c + 1;
  }
  levelData.m_data.m_cap._4_4_ = local_12c;
  levelData.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_58,dVar1);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,
             (deUint32 *)&levelData.m_data.m_cap);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,
             (deUint32)levelData.m_data.m_cap);
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  for (levelH = 0; levelH < levelData.m_data.m_cap._4_4_; levelH = levelH + 1) {
    gMin.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
    gMin.m_data[2] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::Vector<float,_4>::Vector(&local_90,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),1.0);
    randomVector<4>((Functional *)local_80,(Random *)local_58,&local_90,
                    (Vector<float,_4> *)(gMax.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_c0,0.0);
    tcu::Vector<float,_4>::Vector(&local_d0,1.0);
    randomVector<4>((Functional *)local_b0,(Random *)local_58,&local_c0,&local_d0);
    tcu::TextureLevel::setSize
              ((TextureLevel *)&rnd.m_rnd.z,(int)gMin.m_data[3],(int)gMin.m_data[2],1);
    tcu::TextureLevel::getAccess(&local_f8,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithComponentGradients(&local_f8,(Vec4 *)local_80,(Vec4 *)local_b0);
    width = gMin.m_data[3];
    height = gMin.m_data[2];
    dVar1 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_120,(TextureLevel *)&rnd.m_rnd.z);
    data = tcu::PixelBufferAccess::getDataPtr(&local_120);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,levelH,dVar1,(int)width,
               (int)height,0,dVar1,type,data);
  }
  de::Random::~Random((Random *)local_58);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}